

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kapi.cpp
# Opt level: O0

KAPI * __thiscall Kraken::KAPI::public_method(KAPI *this,string *method,Input *input)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  ostream *poVar4;
  char *pcVar5;
  runtime_error *this_00;
  Input *in_RCX;
  string local_2b8 [32];
  ostringstream local_298 [8];
  ostringstream oss;
  CURLcode result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [8];
  string method_url;
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [8];
  string path;
  Input *input_local;
  string *method_local;
  KAPI *this_local;
  string *response;
  
  std::operator+((char *)local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x111148);
  std::operator+(local_68,(char *)local_88);
  std::operator+(local_48,local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::operator+(local_f8,method + 0x40);
  std::operator+(local_d8,(char *)local_f8);
  build_query((Kraken *)&result,in_RCX);
  std::operator+(local_b8,local_d8);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_f8);
  uVar1 = *(undefined8 *)(method + 0x80);
  uVar3 = std::__cxx11::string::c_str();
  curl_easy_setopt(uVar1,0x2712,uVar3);
  curl_easy_setopt(*(undefined8 *)(method + 0x80),0x2727,0);
  std::__cxx11::string::string((string *)this);
  curl_easy_setopt(*(undefined8 *)(method + 0x80),0x2711,this);
  curl_easy_setopt(*(undefined8 *)(method + 0x80),0x50,1);
  iVar2 = curl_easy_perform(*(undefined8 *)(method + 0x80));
  if (iVar2 == 0) {
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)local_48);
    return this;
  }
  std::__cxx11::ostringstream::ostringstream(local_298);
  poVar4 = std::operator<<((ostream *)local_298,"curl_easy_perform() failed: ");
  pcVar5 = (char *)curl_easy_strerror(iVar2);
  std::operator<<(poVar4,pcVar5);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this_00,local_2b8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string KAPI::public_method(const std::string& method, 
				const KAPI::Input& input) const
{
   // build method URL
   std::string path = "/" + version_ + "/public/" + method;
   std::string method_url = url_ + path + "?" + build_query(input);
   curl_easy_setopt(curl_, CURLOPT_URL, method_url.c_str());

   // reset the http header
   curl_easy_setopt(curl_, CURLOPT_HTTPHEADER, NULL);

   // where CURL write callback function stores the response
   std::string response;
   curl_easy_setopt(curl_, CURLOPT_WRITEDATA, static_cast<void*>(&response));

   // Set GET method
   curl_easy_setopt(curl_, CURLOPT_HTTPGET, 1L);

   // perform CURL request
   CURLcode result = curl_easy_perform(curl_);
   if (result != CURLE_OK) {
      std::ostringstream oss;  
      oss << "curl_easy_perform() failed: "<< curl_easy_strerror(result);
      throw std::runtime_error(oss.str());
   }

   return response;
}